

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

ostream * ClipperLib::operator<<(ostream *s,Paths *p)

{
  size_type sVar1;
  const_reference p_00;
  ulong local_20;
  size_type i;
  Paths *p_local;
  ostream *s_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::size(p);
    if (sVar1 <= local_20) break;
    p_00 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](p,local_20);
    operator<<(s,p_00);
    local_20 = local_20 + 1;
  }
  std::operator<<(s,"\n");
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const Paths &p)
{
  for (Paths::size_type i = 0; i < p.size(); i++)
    s << p[i];
  s << "\n";
  return s;
}